

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

stbi_uc * stbi_load(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  stbi_uc *psVar1;
  long in_FS_OFFSET;
  
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    *(char **)(in_FS_OFFSET + -0x30) = "can\'t fopen";
    psVar1 = (stbi_uc *)0x0;
  }
  else {
    psVar1 = stbi_load_from_file((FILE *)__stream,x,y,comp,req_comp);
    fclose(__stream);
  }
  return psVar1;
}

Assistant:

STBIDEF stbi_uc *stbi_load(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   FILE *f = stbi__fopen(filename, "rb");
   unsigned char *result;
   if (!f) return stbi__errpuc("can't fopen", "Unable to open file");
   result = stbi_load_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}